

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx.c
# Opt level: O2

int ps_remove_search(ps_decoder_t *ps,char *name)

{
  int iVar1;
  ps_search_t *ppVar2;
  
  ppVar2 = (ps_search_t *)hash_table_delete(ps->searches,name);
  if (ppVar2 == (ps_search_t *)0x0) {
    iVar1 = -1;
  }
  else {
    if (ps->search == ppVar2) {
      ps->search = (ps_search_t *)0x0;
    }
    (*ppVar2->vt->free)(ppVar2);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int 
ps_remove_search(ps_decoder_t *ps, const char *name)
{
    ps_search_t *search = hash_table_delete(ps->searches, name);
    if (!search)
        return -1;
    if (ps->search == search)
        ps->search = NULL;
    ps_search_free(search);
    return 0;
}